

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall GraphPropagator::attachToAll(GraphPropagator *this)

{
  int j;
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < (int)(this->vs).sz; lVar1 = lVar1 + 1) {
    BoolView::attach((BoolView *)
                     ((long)&(((this->vs).data)->super_Var).super_Branching._vptr_Branching + lVar2)
                     ,&this->super_Propagator,(int)lVar1,6);
    lVar2 = lVar2 + 0x10;
  }
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < (int)(this->es).sz; lVar1 = lVar1 + 1) {
    BoolView::attach((BoolView *)
                     ((long)&(((this->es).data)->super_Var).super_Branching._vptr_Branching + lVar2)
                     ,&this->super_Propagator,(int)lVar1,6);
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

void GraphPropagator::attachToAll() {
	// Do not use in inheriting classes!!
	for (int j = 0; j < nbNodes(); j++) {
		getNodeVar(j).attach(this, j, EVENT_LU);
	}
	for (int j = 0; j < nbEdges(); j++) {
		getEdgeVar(j).attach(this, j, EVENT_LU);
	}
}